

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void google::protobuf::FieldOptions::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  HasBits<1> *pHVar1;
  uint uVar2;
  MessageLite *pMVar3;
  MessageLite *pMVar4;
  char *failure_msg;
  void *pvVar5;
  int line;
  Arena *arena;
  FieldOptions *_this;
  FieldOptions *local_30;
  MessageLite *local_28 [2];
  
  arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  local_30 = (FieldOptions *)to_msg;
  local_28[0] = from_msg;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<google::protobuf::FieldOptions_const*,google::protobuf::FieldOptions*>
                          ((FieldOptions **)local_28,&local_30,"&from != _this");
  if (failure_msg != (Nullable<const_char_*>)0x0) {
    line = 0x28a6;
LAB_0017b7df:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
               ,line,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_28)
    ;
  }
  RepeatedField<int>::MergeFrom
            (&(local_30->field_0)._impl_.targets_,(RepeatedField<int> *)(from_msg + 3));
  RepeatedPtrField<google::protobuf::FieldOptions_EditionDefault>::MergeFrom
            (&(local_30->field_0)._impl_.edition_defaults_,
             (RepeatedPtrField<google::protobuf::FieldOptions_EditionDefault> *)(from_msg + 4));
  RepeatedPtrField<google::protobuf::UninterpretedOption>::MergeFrom
            (&(local_30->field_0)._impl_.uninterpreted_option_,
             (RepeatedPtrField<google::protobuf::UninterpretedOption> *)
             &from_msg[5]._internal_metadata_);
  uVar2 = (uint)from_msg[2]._internal_metadata_.ptr_;
  if ((char)uVar2 != '\0') {
    if ((uVar2 & 1) != 0) {
      pMVar3 = (MessageLite *)from_msg[7]._vptr_MessageLite;
      if (pMVar3 == (MessageLite *)0x0) {
        failure_msg = "from._impl_.features_ != nullptr";
        line = 0x28b2;
        goto LAB_0017b7df;
      }
      pMVar4 = *(MessageLite **)((long)&local_30->field_0 + 0x60);
      if (pMVar4 == (MessageLite *)0x0) {
        pvVar5 = Arena::CopyConstruct<google::protobuf::FeatureSet>(arena,pMVar3);
        *(void **)((long)&local_30->field_0 + 0x60) = pvVar5;
      }
      else {
        FeatureSet::MergeImpl(pMVar4,pMVar3);
      }
    }
    if ((uVar2 & 2) != 0) {
      pMVar3 = (MessageLite *)from_msg[7]._internal_metadata_.ptr_;
      if (pMVar3 == (MessageLite *)0x0) {
        failure_msg = "from._impl_.feature_support_ != nullptr";
        line = 0x28ba;
        goto LAB_0017b7df;
      }
      pMVar4 = *(MessageLite **)((long)&local_30->field_0 + 0x68);
      if (pMVar4 == (MessageLite *)0x0) {
        pvVar5 = Arena::CopyConstruct<google::protobuf::FieldOptions_FeatureSupport>(arena,pMVar3);
        *(void **)((long)&local_30->field_0 + 0x68) = pvVar5;
      }
      else {
        FieldOptions_FeatureSupport::MergeImpl(pMVar4,pMVar3);
      }
    }
    if ((uVar2 & 4) != 0) {
      *(undefined4 *)((long)&local_30->field_0 + 0x70) =
           *(undefined4 *)&from_msg[8]._vptr_MessageLite;
    }
    if ((uVar2 & 8) != 0) {
      (local_30->field_0)._impl_.packed_ = *(bool *)((long)&from_msg[8]._vptr_MessageLite + 4);
    }
    if ((uVar2 & 0x10) != 0) {
      (local_30->field_0)._impl_.deprecated_ = *(bool *)((long)&from_msg[8]._vptr_MessageLite + 5);
    }
    if ((uVar2 & 0x20) != 0) {
      (local_30->field_0)._impl_.lazy_ = *(bool *)((long)&from_msg[8]._vptr_MessageLite + 6);
    }
    if ((uVar2 & 0x40) != 0) {
      (local_30->field_0)._impl_.weak_ = *(bool *)((long)&from_msg[8]._vptr_MessageLite + 7);
    }
    if ((char)uVar2 < '\0') {
      *(int *)((long)&local_30->field_0 + 0x78) = (int)from_msg[8]._internal_metadata_.ptr_;
    }
  }
  if ((uVar2 & 0x700) != 0) {
    if ((uVar2 >> 8 & 1) != 0) {
      (local_30->field_0)._impl_.unverified_lazy_ =
           *(bool *)((long)&from_msg[8]._internal_metadata_.ptr_ + 4);
    }
    if ((uVar2 >> 9 & 1) != 0) {
      (local_30->field_0)._impl_.debug_redact_ =
           *(bool *)((long)&from_msg[8]._internal_metadata_.ptr_ + 5);
    }
    if ((uVar2 >> 10 & 1) != 0) {
      *(undefined4 *)((long)&local_30->field_0 + 0x80) =
           *(undefined4 *)&from_msg[9]._vptr_MessageLite;
    }
  }
  pHVar1 = &(local_30->field_0)._impl_._has_bits_;
  pHVar1->has_bits_[0] = pHVar1->has_bits_[0] | uVar2;
  internal::ExtensionSet::MergeFrom
            (&(local_30->field_0)._impl_._extensions_,(MessageLite *)_FieldOptions_default_instance_
             ,(ExtensionSet *)(from_msg + 1));
  internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(local_30->super_Message).super_MessageLite._internal_metadata_,
             &from_msg->_internal_metadata_);
  return;
}

Assistant:

void FieldOptions::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<FieldOptions*>(&to_msg);
  auto& from = static_cast<const FieldOptions&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.FieldOptions)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_targets()->MergeFrom(from._internal_targets());
  _this->_internal_mutable_edition_defaults()->MergeFrom(
      from._internal_edition_defaults());
  _this->_internal_mutable_uninterpreted_option()->MergeFrom(
      from._internal_uninterpreted_option());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      ABSL_DCHECK(from._impl_.features_ != nullptr);
      if (_this->_impl_.features_ == nullptr) {
        _this->_impl_.features_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.features_);
      } else {
        _this->_impl_.features_->MergeFrom(*from._impl_.features_);
      }
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(from._impl_.feature_support_ != nullptr);
      if (_this->_impl_.feature_support_ == nullptr) {
        _this->_impl_.feature_support_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.feature_support_);
      } else {
        _this->_impl_.feature_support_->MergeFrom(*from._impl_.feature_support_);
      }
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_impl_.ctype_ = from._impl_.ctype_;
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _this->_impl_.packed_ = from._impl_.packed_;
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      _this->_impl_.deprecated_ = from._impl_.deprecated_;
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      _this->_impl_.lazy_ = from._impl_.lazy_;
    }
    if ((cached_has_bits & 0x00000040u) != 0) {
      _this->_impl_.weak_ = from._impl_.weak_;
    }
    if ((cached_has_bits & 0x00000080u) != 0) {
      _this->_impl_.jstype_ = from._impl_.jstype_;
    }
  }
  if ((cached_has_bits & 0x00000700u) != 0) {
    if ((cached_has_bits & 0x00000100u) != 0) {
      _this->_impl_.unverified_lazy_ = from._impl_.unverified_lazy_;
    }
    if ((cached_has_bits & 0x00000200u) != 0) {
      _this->_impl_.debug_redact_ = from._impl_.debug_redact_;
    }
    if ((cached_has_bits & 0x00000400u) != 0) {
      _this->_impl_.retention_ = from._impl_.retention_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_impl_._extensions_.MergeFrom(&default_instance(), from._impl_._extensions_);
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}